

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * __thiscall FxFlopFunctionCall::Resolve(FxFlopFunctionCall *this,FCompileContext *ctx)

{
  FArgumentList *pFVar1;
  PString *pPVar2;
  PFloat *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  FxExpression *this_00;
  FxExpression *pFVar5;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *other;
  FString FVar6;
  FxJumpStatement **ppFVar7;
  FString local_20;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    pFVar1 = this->ArgList;
    if ((pFVar1 == (FArgumentList *)0x0) ||
       ((pFVar1->super_TArray<FxExpression_*,_FxExpression_*>).Count != 1)) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"%s only has one parameter",
                 FName::NameData.NameArray
                 [(int)FxFlops[*(int *)&(this->super_FxExpression).field_0x34].Name].Text);
    }
    else {
      iVar4 = (*(*(pFVar1->super_TArray<FxExpression_*,_FxExpression_*>).Array)->_vptr_FxExpression
                [2])();
      *(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array =
           (FxExpression *)CONCAT44(extraout_var,iVar4);
      pFVar5 = *(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array;
      if (pFVar5 != (FxExpression *)0x0) {
        if ((pFVar5->ValueType != (PType *)TypeName) &&
           ((iVar4 = (**(code **)(*(long *)&pFVar5->ValueType->super_DObject + 0x90))(), iVar4 == 0
            || (iVar4 = (*(pFVar5->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar4 == 1))))
        {
          iVar4 = (*(*(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array)->
                    _vptr_FxExpression[3])();
          if ((char)iVar4 != '\0') {
            pFVar5 = *(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array;
            pPVar2 = (PString *)pFVar5[1]._vptr_FxExpression;
            other = &pFVar5[1].JumpAddresses;
            if (pPVar2 == TypeString) {
              FString::AttachToOther(&local_20,(FString *)other);
            }
            else {
              local_20.Chars = (char *)other->Array;
            }
            iVar4 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
            FVar6.Chars = local_20.Chars;
            if ((iVar4 != 1) && (FVar6.Chars = (char *)(FxJumpStatement **)0x0, iVar4 == 0)) {
              FVar6.Chars = (char *)(double)(int)local_20.Chars;
            }
            if (pPVar2 == TypeString) {
              FString::~FString(&local_20);
            }
            ppFVar7 = (FxJumpStatement **)
                      (*FxFlops[*(int *)&(this->super_FxExpression).field_0x34].Evaluate)
                                ((double)FVar6.Chars);
            pFVar5 = (FxExpression *)operator_new(0x48);
            FxExpression::FxExpression(pFVar5,&(this->super_FxExpression).ScriptPosition);
            pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
            pPVar3 = TypeFloat64;
            *(PFloat **)(pFVar5 + 1) = TypeFloat64;
            pFVar5->ValueType = (PType *)pPVar3;
            pFVar5[1].JumpAddresses.Array = ppFVar7;
            pFVar5->isresolved = true;
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            return pFVar5;
          }
          iVar4 = (*((*(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array)->
                     ValueType->super_DObject)._vptr_DObject[0x12])();
          if (iVar4 == 0) {
            this_00 = (FxExpression *)operator_new(0x40);
            pFVar5 = *(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array;
            FxExpression::FxExpression(this_00,&pFVar5->ScriptPosition);
            this_00->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0088e520;
            this_00[1]._vptr_FxExpression = (_func_int **)pFVar5;
            this_00->ValueType = (PType *)TypeFloat64;
            *(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array = this_00;
          }
          (this->super_FxExpression).ValueType = (PType *)TypeFloat64;
          return &this->super_FxExpression;
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "numeric value expected for parameter");
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxFlopFunctionCall *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxFlopFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	if (ArgList == NULL || ArgList->Size() != 1)
	{
		ScriptPosition.Message(MSG_ERROR, "%s only has one parameter", FName(FxFlops[Index].Name).GetChars());
		delete this;
		return NULL;
	}

	(*ArgList)[0] = (*ArgList)[0]->Resolve(ctx);
	if ((*ArgList)[0] == NULL)
	{
		delete this;
		return NULL;
	}

	if (!(*ArgList)[0]->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "numeric value expected for parameter");
		delete this;
		return NULL;
	}
	if ((*ArgList)[0]->isConstant())
	{
		double v = static_cast<FxConstant *>((*ArgList)[0])->GetValue().GetFloat();
		v = FxFlops[Index].Evaluate(v);
		FxExpression *x = new FxConstant(v, ScriptPosition);
		delete this;
		return x;
	}
	if ((*ArgList)[0]->ValueType->GetRegType() == REGT_INT)
	{
		(*ArgList)[0] = new FxFloatCast((*ArgList)[0]);
	}
	ValueType = TypeFloat64;
	return this;
}